

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O0

void text_screen_byte(ubyte iobyte,uint address)

{
  byte bVar1;
  byte bVar2;
  uint local_c;
  ubyte local_9;
  ubyte row;
  ubyte column;
  uint address_local;
  ubyte iobyte_local;
  
  local_c = address;
  if (address < screen_start) {
    local_c = address + 0x400;
  }
  bVar1 = (char)((ulong)(ushort)(local_c - screen_start) % 0x28) + 1;
  bVar2 = (char)((ulong)(ushort)(local_c - screen_start) / 0x28) + 1;
  if ((bVar1 != 0x28) || (bVar2 != 0x19)) {
    gotoxy((ushort)bVar1,(ushort)bVar2);
    local_9 = iobyte;
    switch(iobyte) {
    case '#':
      local_9 = '?';
      break;
    case '[':
      local_9 = '\x1b';
      break;
    case '\\':
      local_9 = '?';
      break;
    case ']':
      local_9 = '\x1a';
      break;
    case '^':
      local_9 = '\x18';
      break;
    case '_':
      local_9 = '#';
      break;
    case '`':
      local_9 = '?';
      break;
    case '{':
      local_9 = '?';
      break;
    case '|':
      local_9 = '?';
      break;
    case '}':
      local_9 = '}';
      break;
    case '~':
      local_9 = '?';
      break;
    case '\x7f':
      local_9 = '?';
    }
    putch(local_9);
    update_cursor();
  }
  return;
}

Assistant:

void text_screen_byte(ubyte iobyte, uint address) {
    ubyte column = 1;                          // init column (first column=1)
    ubyte row = 1;                             // init row    (first row=1)

    if (address < screen_start) address += 0x400;// deal with hardware wrap-around
    address -= screen_start;                   //

    column += address % 40;                      // calculate column
    row += address / 40;                         // calculate row
    if (column == 40 && row == 25)      // if bottom right, return since, any putchar
        return;                    // in this position will scroll the screen

    gotoxy(column, row);           // move pc cursor to correct position


    switch (iobyte) {                 // convert pc characters to teletext
        // characters
        case '_':
            iobyte = '#';
            break;
        case '[':
            iobyte = '\x1B';
            break; // some of these conversion are not
        case '\\':
            iobyte = '?';
            break; // stricly correct, since no corresponding
        case ']':
            iobyte = '\x1A';
            break; // character in the pc set exists
        case '^':
            iobyte = '\x18';
            break; //
        case '`':
            iobyte = '?';
            break; // notably the } characters is not
        case '#':
            iobyte = '?';
            break; // converted to the proper 3/4 symbol
        case '{':
            iobyte = '?';
            break;
        case '|':
            iobyte = '?';
            break;
        case '}':
            iobyte = '}';
            break;
        case '~':
            iobyte = '?';
            break;
        case 0x7F:
            iobyte = '?';
            break; // This conversion takes place because
            // 0x7F is used for the cursor when
            // copying
    }

    putch(iobyte);                            // Ouput the character

    update_cursor();                 // update to the correct position
    // as specified in the BBC hardware
}